

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O0

int run_test_fs_poll_close_request_multi_stop_start(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int local_3c4;
  undefined1 local_3c0 [4];
  int i;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  
  remove("testfile");
  iVar1 = uv_loop_init((uv_loop_t *)&poll_handle.poll_ctx);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0xfe,"0 == uv_loop_init(&loop)");
    abort();
  }
  iVar1 = uv_fs_poll_init((uv_loop_t *)&poll_handle.poll_ctx,(uv_fs_poll_t *)local_3c0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0x100,"0 == uv_fs_poll_init(&loop, &poll_handle)");
    abort();
  }
  for (local_3c4 = 0; local_3c4 < 10; local_3c4 = local_3c4 + 1) {
    iVar1 = uv_fs_poll_stop((uv_fs_poll_t *)local_3c0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
              ,0x103,"0 == uv_fs_poll_stop(&poll_handle)");
      abort();
    }
    iVar1 = uv_fs_poll_start((uv_fs_poll_t *)local_3c0,poll_cb_fail,"testfile",100);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
              ,0x104,"0 == uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100)");
      abort();
    }
  }
  uv_close((uv_handle_t *)local_3c0,close_cb);
  while (close_cb_called == 0) {
    uv_run((uv_loop_t *)&poll_handle.poll_ctx,UV_RUN_ONCE);
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0x109,"close_cb_called == 1");
    abort();
  }
  iVar1 = uv_loop_close((uv_loop_t *)&poll_handle.poll_ctx);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0x10b,"0 == uv_loop_close(&loop)");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0x10d,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_poll_close_request_multi_stop_start) {
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;
  int i;

  remove(FIXTURE);

  ASSERT(0 == uv_loop_init(&loop));

  ASSERT(0 == uv_fs_poll_init(&loop, &poll_handle));

  for (i = 0; i < 10; ++i) {
    ASSERT(0 == uv_fs_poll_stop(&poll_handle));
    ASSERT(0 == uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
  }
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  while (close_cb_called == 0)
    uv_run(&loop, UV_RUN_ONCE);
  ASSERT(close_cb_called == 1);

  ASSERT(0 == uv_loop_close(&loop));

  MAKE_VALGRIND_HAPPY();
  return 0;
}